

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::LoadDynamicProfileInfo(FunctionBody *this)

{
  bool bVar1;
  uint sourceContextId;
  LocalFunctionId functionId;
  SourceContextInfo *pSVar2;
  SourceDynamicProfileManager **ppSVar3;
  DynamicProfileInfo *pDVar4;
  DynamicProfileInfo **ppDVar5;
  SourceDynamicProfileManager *sourceDynamicProfileManager;
  FunctionBody *this_local;
  
  pSVar2 = FunctionProxy::GetSourceContextInfo((FunctionProxy *)this);
  ppSVar3 = Memory::WriteBarrierPtr::operator_cast_to_SourceDynamicProfileManager__
                      ((WriteBarrierPtr *)&pSVar2->sourceDynamicProfileManager);
  if (*ppSVar3 != (SourceDynamicProfileManager *)0x0) {
    pDVar4 = SourceDynamicProfileManager::GetDynamicProfileInfo(*ppSVar3,this);
    Memory::WriteBarrierPtr<Js::DynamicProfileInfo>::operator=(&this->dynamicProfileInfo,pDVar4);
    ppDVar5 = Memory::WriteBarrierPtr::operator_cast_to_DynamicProfileInfo__
                        ((WriteBarrierPtr *)&this->dynamicProfileInfo);
    if (*ppDVar5 != (DynamicProfileInfo *)0x0) {
      sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)this);
      functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
      bVar1 = Phases::IsEnabled((Phases *)&DAT_01ea1258,DynamicProfilePhase,sourceContextId,
                                functionId);
      if (bVar1) {
        Output::Print(L"Loaded:");
        pDVar4 = Memory::WriteBarrierPtr<Js::DynamicProfileInfo>::operator->
                           (&this->dynamicProfileInfo);
        DynamicProfileInfo::Dump(pDVar4,this,(ArenaAllocator *)0x0);
      }
    }
  }
  DynamicProfileMutator::Mutate(this);
  return;
}

Assistant:

void FunctionBody::LoadDynamicProfileInfo()
    {
        SourceDynamicProfileManager * sourceDynamicProfileManager = GetSourceContextInfo()->sourceDynamicProfileManager;
        if (sourceDynamicProfileManager != nullptr)
        {
            this->dynamicProfileInfo = sourceDynamicProfileManager->GetDynamicProfileInfo(this);
#if DBG_DUMP
            if(this->dynamicProfileInfo)
            {
                if (Configuration::Global.flags.Dump.IsEnabled(DynamicProfilePhase, this->GetSourceContextId(), this->GetLocalFunctionId()))
                {
                    Output::Print(_u("Loaded:"));
                    this->dynamicProfileInfo->Dump(this);
                }
            }
#endif
        }

#ifdef DYNAMIC_PROFILE_MUTATOR
        DynamicProfileMutator::Mutate(this);
#endif
    }